

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

int AF_A_PhoenixPuff(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  bool bVar1;
  bool local_fe;
  bool local_fb;
  Vector2 local_f8;
  TVector3<double> local_e8;
  TAngle<double> local_d0;
  DVector3 local_c8;
  FName local_ac;
  Vector2 local_a8;
  TVector3<double> local_98;
  TAngle<double> local_80;
  DVector3 local_78;
  FName local_5c;
  TAngle<double> local_58;
  DAngle angle;
  AActor *puff;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                  ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    this = (AActor *)(param->field_0).field_1.a;
    local_fb = true;
    if (this != (AActor *)0x0) {
      local_fb = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_fb == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                    ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
        bVar1 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      this_00 = (DObject *)param[1].field_0.field_1.a;
      local_fe = true;
      if (this_00 != (DObject *)0x0) {
        local_fe = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_fe == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
        bVar1 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    TAngle<double>::TAngle(&local_58);
    FName::FName(&local_5c,"PhoenixPuff");
    AActor::Pos(&local_78,this);
    angle.Degrees = (double)Spawn(&local_5c,&local_78,ALLOW_REPLACE);
    TAngle<double>::operator+(&local_80,90.0);
    TAngle<double>::operator=(&local_58,&local_80);
    TAngle<double>::ToVector((TAngle<double> *)&local_a8,1.3);
    TVector3<double>::TVector3(&local_98,&local_a8,0.0);
    TVector3<double>::operator=((TVector3<double> *)((long)angle.Degrees + 0xa8),&local_98);
    FName::FName(&local_ac,"PhoenixPuff");
    AActor::Pos(&local_c8,this);
    angle.Degrees = (double)Spawn(&local_ac,&local_c8,ALLOW_REPLACE);
    TAngle<double>::operator-(&local_d0,90.0);
    TAngle<double>::operator=(&local_58,&local_d0);
    TAngle<double>::ToVector((TAngle<double> *)&local_f8,1.3);
    TVector3<double>::TVector3(&local_e8,&local_f8,0.0);
    TVector3<double>::operator=((TVector3<double> *)((long)angle.Degrees + 0xa8),&local_e8);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PhoenixPuff)
{
	PARAM_ACTION_PROLOGUE;

	AActor *puff;
	DAngle angle;

	//[RH] Heretic never sets the target for seeking
	//P_SeekerMissile (self, 5, 10);
	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw + 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);

	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw - 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);
	return 0;
}